

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckerboardPatternOfAsterisks.c
# Opt level: O0

int main(void)

{
  int local_14;
  int local_10;
  int internalCounter;
  int externalCounter;
  
  for (local_10 = 1; local_14 = 1, local_10 < 9; local_10 = local_10 + 1) {
    if (local_10 % 2 == 0) {
      printf("%s"," ");
    }
    for (; local_14 < 9; local_14 = local_14 + 1) {
      printf("%s","* ");
    }
    puts("");
  }
  return 0;
}

Assistant:

int main (void) {
    int externalCounter = 1;
    int internalCounter = 1;

    while (externalCounter <= 8) {
        if (externalCounter % 2 == 0) {
            printf("%s", " ");

        }
        while (internalCounter <= 8) {
            printf("%s", "* ");
            internalCounter++;

        }
        puts("");
        externalCounter++;
        internalCounter = 1;

    }

    return 0;

}